

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  void *pvVar2;
  ssize_t sVar3;
  uint *puVar4;
  undefined8 *in_RCX;
  ssize_t *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  mtree *mtree;
  ssize_t bytes_read;
  size_t bytes_to_read;
  size_t local_30;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(int *)(lVar1 + 0x30) < 0) {
    *in_RSI = 0;
    *in_RCX = 0;
    *in_RDX = 0;
    local_4 = 1;
  }
  else {
    if (*(long *)(lVar1 + 0x20) == 0) {
      *(undefined8 *)(lVar1 + 0x18) = 0x10000;
      pvVar2 = malloc(*(size_t *)(lVar1 + 0x18));
      *(void **)(lVar1 + 0x20) = pvVar2;
      if (*(long *)(lVar1 + 0x20) == 0) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
        return -0x1e;
      }
    }
    *in_RSI = *(undefined8 *)(lVar1 + 0x20);
    *in_RCX = *(undefined8 *)(lVar1 + 0x28);
    if (*(long *)(lVar1 + 0x88) - *(long *)(lVar1 + 0x28) < *(long *)(lVar1 + 0x18)) {
      local_30 = *(long *)(lVar1 + 0x88) - *(long *)(lVar1 + 0x28);
    }
    else {
      local_30 = *(size_t *)(lVar1 + 0x18);
    }
    sVar3 = read(*(int *)(lVar1 + 0x30),*(void **)(lVar1 + 0x20),local_30);
    if (sVar3 < 0) {
      puVar4 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t read");
      local_4 = -0x14;
    }
    else if (sVar3 == 0) {
      *in_RDX = 0;
      local_4 = 1;
    }
    else {
      *(ssize_t *)(lVar1 + 0x28) = sVar3 + *(long *)(lVar1 + 0x28);
      *in_RDX = sVar3;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
read_data(struct archive_read *a, const void **buff, size_t *size, int64_t *offset)
{
	size_t bytes_to_read;
	ssize_t bytes_read;
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd < 0) {
		*buff = NULL;
		*offset = 0;
		*size = 0;
		return (ARCHIVE_EOF);
	}
	if (mtree->buff == NULL) {
		mtree->buffsize = 64 * 1024;
		mtree->buff = malloc(mtree->buffsize);
		if (mtree->buff == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
	}

	*buff = mtree->buff;
	*offset = mtree->offset;
	if ((int64_t)mtree->buffsize > mtree->cur_size - mtree->offset)
		bytes_to_read = (size_t)(mtree->cur_size - mtree->offset);
	else
		bytes_to_read = mtree->buffsize;
	bytes_read = read(mtree->fd, mtree->buff, bytes_to_read);
	if (bytes_read < 0) {
		archive_set_error(&a->archive, errno, "Can't read");
		return (ARCHIVE_WARN);
	}
	if (bytes_read == 0) {
		*size = 0;
		return (ARCHIVE_EOF);
	}
	mtree->offset += bytes_read;
	*size = bytes_read;
	return (ARCHIVE_OK);
}